

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blurredsegment.cpp
# Opt level: O2

Pt2i __thiscall BlurredSegment::getMiddle(BlurredSegment *this)

{
  Pt2i lp;
  Pt2i rp;
  
  BiPtList::backPoint((BiPtList *)&rp);
  BiPtList::frontPoint((BiPtList *)&lp);
  Pt2i::Pt2i((Pt2i *)this,(lp.xp + rp.xp) / 2,(lp.yp + rp.yp) / 2);
  return (Pt2i)this;
}

Assistant:

const Pt2i BlurredSegment::getMiddle () const
{
  Pt2i rp = plist->backPoint ();
  Pt2i lp = plist->frontPoint ();
  return (Pt2i ((rp.x () + lp.x ()) / 2, (rp.y () + lp.y ()) / 2));
}